

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FxExpression_*,_FxExpression_*>::~TDeletingArray
          (TDeletingArray<FxExpression_*,_FxExpression_*> *this)

{
  uint uVar1;
  FxExpression **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FxExpression_*,_FxExpression_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                        (&this->super_TArray<FxExpression_*,_FxExpression_*>), local_14 < uVar1;
      local_14 = local_14 + 1) {
    ppFVar2 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                        (&this->super_TArray<FxExpression_*,_FxExpression_*>,(ulong)local_14);
    if (*ppFVar2 != (FxExpression *)0x0) {
      ppFVar2 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&this->super_TArray<FxExpression_*,_FxExpression_*>,(ulong)local_14);
      if (*ppFVar2 != (FxExpression *)0x0) {
        (*(*ppFVar2)->_vptr_FxExpression[1])();
      }
    }
  }
  TArray<FxExpression_*,_FxExpression_*>::~TArray
            (&this->super_TArray<FxExpression_*,_FxExpression_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}